

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowIfNewPeer(Parse *pParse,ExprList *pOrderBy,int regNew,int regOld,int addr)

{
  int p3;
  int iVar1;
  int iVar2;
  Vdbe *p;
  KeyInfo *pP4;
  KeyInfo *pKeyInfo;
  int nVal;
  Vdbe *v;
  int addr_local;
  int regOld_local;
  int regNew_local;
  ExprList *pOrderBy_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  if (pOrderBy == (ExprList *)0x0) {
    sqlite3VdbeAddOp2(p,8,0,addr);
  }
  else {
    p3 = pOrderBy->nExpr;
    pP4 = sqlite3KeyInfoFromExprList(pParse,pOrderBy,0,0);
    sqlite3VdbeAddOp3(p,0x5a,regOld,regNew,p3);
    sqlite3VdbeAppendP4(p,pP4,-8);
    iVar1 = sqlite3VdbeCurrentAddr(p);
    iVar2 = sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp3(p,0xd,iVar1 + 1,addr,iVar2 + 1);
    sqlite3VdbeAddOp3(p,0x50,regNew,regOld,p3 + -1);
  }
  return;
}

Assistant:

static void windowIfNewPeer(
  Parse *pParse,
  ExprList *pOrderBy,
  int regNew,                     /* First in array of new values */
  int regOld,                     /* First in array of old values */
  int addr                        /* Jump here */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( pOrderBy ){
    int nVal = pOrderBy->nExpr;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOrderBy, 0, 0);
    sqlite3VdbeAddOp3(v, OP_Compare, regOld, regNew, nVal);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump,
      sqlite3VdbeCurrentAddr(v)+1, addr, sqlite3VdbeCurrentAddr(v)+1
    );
    VdbeCoverageEqNe(v);
    sqlite3VdbeAddOp3(v, OP_Copy, regNew, regOld, nVal-1);
  }else{
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  }
}